

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O0

int __thiscall Ym2612_Impl::CHANNEL_SET(Ym2612_Impl *this,int Adr,int data)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  slot_t *sl;
  int i;
  channel_t *ch;
  int num;
  undefined4 local_4c;
  int local_2c;
  int local_4;
  
  uVar2 = in_ESI & 3;
  if (uVar2 == 3) {
    local_4 = 1;
  }
  else {
    lVar1 = in_RDI + 0x28 + (long)(int)(uVar2 + (in_ESI >> 8 & 1) * 3) * 0x2a0;
    switch(in_ESI & 0xfc) {
    case 0xa0:
      YM2612_Special_Update();
      *(uint *)(lVar1 + 0x28) = (*(uint *)(lVar1 + 0x28) & 0x700) + in_EDX;
      *(uint *)(lVar1 + 0x48) = *(int *)(lVar1 + 0x38) << 2 | (uint)""[*(int *)(lVar1 + 0x28) >> 7];
      *(undefined4 *)(lVar1 + 0xac) = 0xffffffff;
      break;
    case 0xa4:
      YM2612_Special_Update();
      *(uint *)(lVar1 + 0x28) = (*(uint *)(lVar1 + 0x28) & 0xff) + (in_EDX & 7) * 0x100;
      *(int *)(lVar1 + 0x38) = (int)(in_EDX & 0x38) >> 3;
      *(uint *)(lVar1 + 0x48) = *(int *)(lVar1 + 0x38) << 2 | (uint)""[*(int *)(lVar1 + 0x28) >> 7];
      *(undefined4 *)(lVar1 + 0xac) = 0xffffffff;
      break;
    case 0xa8:
      if ((int)in_ESI < 0x100) {
        iVar3 = uVar2 + 1;
        YM2612_Special_Update();
        *(uint *)(in_RDI + 0x590 + (long)iVar3 * 4) =
             (*(uint *)(in_RDI + 0x590 + (long)iVar3 * 4) & 0x700) + in_EDX;
        *(uint *)(in_RDI + 0x5b0 + (long)iVar3 * 4) =
             *(int *)(in_RDI + 0x5a0 + (long)iVar3 * 4) << 2 |
             (uint)""[*(int *)(in_RDI + 0x590 + (long)iVar3 * 4) >> 7];
        *(undefined4 *)(in_RDI + 0x614) = 0xffffffff;
      }
      break;
    case 0xac:
      if ((int)in_ESI < 0x100) {
        iVar3 = uVar2 + 1;
        YM2612_Special_Update();
        *(uint *)(in_RDI + 0x590 + (long)iVar3 * 4) =
             (*(uint *)(in_RDI + 0x590 + (long)iVar3 * 4) & 0xff) + (in_EDX & 7) * 0x100;
        *(int *)(in_RDI + 0x5a0 + (long)iVar3 * 4) = (int)(in_EDX & 0x38) >> 3;
        *(uint *)(in_RDI + 0x5b0 + (long)iVar3 * 4) =
             *(int *)(in_RDI + 0x5a0 + (long)iVar3 * 4) << 2 |
             (uint)""[*(int *)(in_RDI + 0x590 + (long)iVar3 * 4) >> 7];
        *(undefined4 *)(in_RDI + 0x614) = 0xffffffff;
      }
      break;
    case 0xb0:
      if (*(uint *)(lVar1 + 0x18) != (in_EDX & 7)) {
        YM2612_Special_Update();
        *(uint *)(lVar1 + 0x18) = in_EDX & 7;
        *(undefined4 *)(lVar1 + 0xdc) = 0;
        *(undefined4 *)(lVar1 + 0x16c) = 0;
        *(undefined4 *)(lVar1 + 0x1fc) = 0;
        *(undefined4 *)(lVar1 + 0x28c) = 0;
      }
      *(uint *)(lVar1 + 0x1c) = 9 - ((int)in_EDX >> 3 & 7U);
      break;
    case 0xb4:
      YM2612_Special_Update();
      *(uint *)(lVar1 + 0x10) = -((int)in_EDX >> 7 & 1U);
      *(uint *)(lVar1 + 0x14) = -((int)in_EDX >> 6 & 1U);
      *(uint *)(lVar1 + 0x24) = (uint)"\x1f\x04\x01"[(int)((int)in_EDX >> 4 & 3)];
      *(uint *)(lVar1 + 0x20) = (uint)""[(int)(in_EDX & 7)];
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        lVar4 = lVar1 + 0x58 + (long)local_2c * 0x90;
        if (*(int *)(lVar4 + 0x8c) == 0) {
          local_4c = 0x1f;
        }
        else {
          local_4c = *(undefined4 *)(lVar1 + 0x24);
        }
        *(undefined4 *)(lVar4 + 0x88) = local_4c;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Ym2612_Impl::CHANNEL_SET( int Adr, int data )
{
	int num = Adr & 3;
	if ( num == 3 )
		return 1;
	
	channel_t& ch = YM2612.CHANNEL [num + (Adr & 0x100 ? 3 : 0)];
	
	switch ( Adr & 0xFC )
	{
		case 0xA0:
			YM2612_Special_Update();

			ch.FNUM [0] = (ch.FNUM [0] & 0x700) + data;
			ch.KC [0] = (ch.FOCT [0] << 2) | FKEY_TAB [ch.FNUM [0] >> 7];

			ch.SLOT [0].Finc = -1;
			break;

		case 0xA4:
			YM2612_Special_Update();

			ch.FNUM [0] = (ch.FNUM [0] & 0x0FF) + ((data & 0x07) << 8);
			ch.FOCT [0] = (data & 0x38) >> 3;
			ch.KC [0] = (ch.FOCT [0] << 2) | FKEY_TAB [ch.FNUM [0] >> 7];

			ch.SLOT [0].Finc = -1;
			break;

		case 0xA8:
			if ( Adr < 0x100 )
			{
				num++;

				YM2612_Special_Update();

				YM2612.CHANNEL [2].FNUM [num] = (YM2612.CHANNEL [2].FNUM [num] & 0x700) + data;
				YM2612.CHANNEL [2].KC [num] = (YM2612.CHANNEL [2].FOCT [num] << 2) |
						FKEY_TAB [YM2612.CHANNEL [2].FNUM [num] >> 7];

				YM2612.CHANNEL [2].SLOT [0].Finc = -1;
			}
			break;

		case 0xAC:
			if ( Adr < 0x100 )
			{
				num++;

				YM2612_Special_Update();

				YM2612.CHANNEL [2].FNUM [num] = (YM2612.CHANNEL [2].FNUM [num] & 0x0FF) + ((data & 0x07) << 8);
				YM2612.CHANNEL [2].FOCT [num] = (data & 0x38) >> 3;
				YM2612.CHANNEL [2].KC [num] = (YM2612.CHANNEL [2].FOCT [num] << 2) |
						FKEY_TAB [YM2612.CHANNEL [2].FNUM [num] >> 7];

				YM2612.CHANNEL [2].SLOT [0].Finc = -1;
			}
			break;

		case 0xB0:
			if ( ch.ALGO != (data & 7) )
			{
				// Fix VectorMan 2 heli sound (level 1)
				YM2612_Special_Update();

				ch.ALGO = data & 7;
				
				ch.SLOT [0].ChgEnM = 0;
				ch.SLOT [1].ChgEnM = 0;
				ch.SLOT [2].ChgEnM = 0;
				ch.SLOT [3].ChgEnM = 0;
			}

			ch.FB = 9 - ((data >> 3) & 7);                              // Real thing ?

//          if (ch.FB = ((data >> 3) & 7)) ch.FB = 9 - ch.FB;       // Thunder force 4 (music stage 8), Gynoug, Aladdin bug sound...
//          else ch.FB = 31;
			break;

		case 0xB4: {
			YM2612_Special_Update();
			
			ch.LEFT = 0 - ((data >> 7) & 1);
			ch.RIGHT = 0 - ((data >> 6) & 1);
			
			ch.AMS = LFO_AMS_TAB [(data >> 4) & 3];
			ch.FMS = LFO_FMS_TAB [data & 7];
			
			for ( int i = 0; i < 4; i++ )
			{
				slot_t& sl = ch.SLOT [i];
				sl.AMS = (sl.AMSon ? ch.AMS : 31);
			}
			break;
		}
	}
	
	return 0;
}